

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_true,_false>::push_block_(DaTrie<false,_true,_false> *this)

{
  uint uVar1;
  uint uVar2;
  DaTrie<false,_true,_false> *this_00;
  long in_RDI;
  uint32_t i_2;
  uint32_t end;
  uint32_t begin;
  uint32_t i_1;
  uint32_t i;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_stack_ffffffffffffffa0;
  Bc *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  Block local_30;
  NodeLink local_2a;
  uint local_28;
  Bc local_18;
  uint local_10;
  uint32_t local_c;
  
  local_c = num_blocks((DaTrie<false,_true,_false> *)0x1685a8);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    in_stack_ffffffffffffffb0 = &local_18;
    Bc::Bc(in_stack_ffffffffffffffb0);
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::push_back
              (in_stack_ffffffffffffffa0,
               (value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    Bc::~Bc(&local_18);
  }
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    memset(&local_2a,0,2);
    NodeLink::NodeLink(&local_2a);
    std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::push_back
              ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)in_stack_ffffffffffffffa0,
               (value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  this_00 = (DaTrie<false,_true,_false> *)(in_RDI + 0x30);
  memset(&local_30,0,4);
  Block::Block(&local_30);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::push_back
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)this_00,
             (value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  uVar1 = local_c * 0x100;
  uVar2 = uVar1 + 0x100;
  for (; uVar1 < uVar2; uVar1 = uVar1 + 1) {
    set_next_(this_00,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    set_prev_(this_00,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  }
  push_block_((DaTrie<false,_true,_false> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
              (uint32_t)((ulong)in_RDI >> 0x20),
              (vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_stack_ffffffffffffffb0);
  *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }